

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O2

void __thiscall
boost::runtime::arguments_store::
set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (arguments_store *this,cstring *parameter_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value)

{
  typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  mapped_type *this_01;
  shared_ptr<boost::runtime::argument> local_30;
  
  this_00 = (typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)operator_new(0x28);
  typed_argument<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_argument(this_00,value);
  shared_ptr<boost::runtime::argument>::
  shared_ptr<boost::runtime::typed_argument<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_30,this_00);
  this_01 = std::
            map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
            ::operator[](&this->m_arguments,parameter_name);
  shared_ptr<boost::runtime::argument>::operator=(this_01,&local_30);
  detail::shared_count::~shared_count(&local_30.pn);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }